

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void stable_grail_merge_without_buffer(int **arr,int len1,int len2)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int **ppiVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  
  uVar6 = (ulong)(uint)len2;
  if (len1 < len2) {
LAB_001172b7:
    if (len1 != 0) {
      lVar12 = (long)len1;
      iVar5 = (int)uVar6;
      iVar9 = iVar5;
      if (0 < iVar5) {
        uVar2 = 0xffffffff;
        uVar10 = uVar6;
        do {
          uVar7 = ((int)((int)uVar10 - uVar2) >> 1) + uVar2;
          if (**arr <= *arr[lVar12 + (int)uVar7]) {
            uVar10 = (ulong)uVar7;
            uVar7 = uVar2;
          }
          uVar2 = uVar7;
          iVar9 = (int)uVar10;
        } while ((int)uVar2 < iVar9 + -1);
      }
      if (iVar9 != 0) {
        stable_grail_rotate(arr,len1,iVar9);
        arr = arr + iVar9;
        uVar6 = (ulong)(uint)(iVar5 - iVar9);
      }
      if ((int)uVar6 == 0) {
        return;
      }
      lVar4 = 0;
      ppiVar8 = arr;
      do {
        ppiVar8 = ppiVar8 + 1;
        if (lVar12 + -1 == lVar4) {
          len1 = 0;
          arr = ppiVar8;
          goto LAB_001172b7;
        }
        lVar4 = lVar4 + 1;
      } while (**ppiVar8 <= *arr[lVar12]);
      len1 = len1 - (int)lVar4;
      arr = ppiVar8;
      goto LAB_001172b7;
    }
  }
  else if (len2 != 0) {
    do {
      iVar9 = (int)uVar6;
      iVar5 = len1;
      if (0 < len1) {
        iVar1 = -1;
        iVar11 = len1;
        do {
          iVar3 = (iVar11 - iVar1 >> 1) + iVar1;
          iVar5 = iVar3;
          if (*arr[iVar3] <= *arr[(long)(iVar9 + len1) + -1]) {
            iVar5 = iVar11;
            iVar1 = iVar3;
          }
          iVar11 = iVar5;
        } while (iVar1 < iVar5 + -1);
      }
      if (len1 - iVar5 != 0) {
        stable_grail_rotate(arr + iVar5,len1 - iVar5,iVar9);
        len1 = iVar5;
      }
      if (len1 == 0) {
        return;
      }
      uVar6 = (ulong)iVar9;
      do {
        if (uVar6 == 1) {
          uVar6 = 0;
          break;
        }
        lVar12 = uVar6 - 2;
        uVar6 = uVar6 - 1;
      } while (*arr[(long)len1 + -1] <= *arr[len1 + lVar12]);
    } while ((int)uVar6 != 0);
  }
  return;
}

Assistant:

static void GRAIL_MERGE_WITHOUT_BUFFER(SORT_TYPE *arr, int len1, int len2) {
  int h;

  if (len1 < len2) {
    while (len1) {
      h = GRAIL_BIN_SEARCH_LEFT(arr + len1, len2, arr);

      if (h != 0) {
        GRAIL_ROTATE(arr, len1, h);
        arr += h;
        len2 -= h;
      }

      if (len2 == 0) {
        break;
      }

      do {
        arr++;
        len1--;
      } while (len1 && SORT_CMP_A(arr, arr + len1) <= 0);
    }
  } else {
    while (len2) {
      h = GRAIL_BIN_SEARCH_RIGHT(arr, len1, arr + (len1 + len2 - 1));

      if (h != len1) {
        GRAIL_ROTATE(arr + h, len1 - h, len2);
        len1 = h;
      }

      if (len1 == 0) {
        break;
      }

      do {
        len2--;
      } while (len2 && SORT_CMP_A(arr + len1 - 1, arr + len1 + len2 - 1) <= 0);
    }
  }
}